

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void __thiscall re2::Regexp::ParseState::DoCollapse(ParseState *this,RegexpOp op)

{
  bool bVar1;
  RegexpOp RVar2;
  Regexp *pRVar3;
  Regexp *pRVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  Regexp *pRVar8;
  ParseState *this_00;
  ParseState *re;
  ParseState *pPVar9;
  StringPiece *pSVar10;
  int iVar11;
  int len;
  PODArray<re2::Regexp_*> subs;
  
  len = 0;
  pRVar3 = this->stacktop_;
  pRVar4 = pRVar3;
  pRVar8 = (Regexp *)0x0;
  while ((pRVar4 != (Regexp *)0x0 && (pRVar4->op_ < (kRegexpCharClass|kRegexpEmptyMatch)))) {
    uVar7 = 1;
    if (pRVar4->op_ == op) {
      uVar7 = (uint)pRVar4->nsub_;
    }
    len = len + uVar7;
    pRVar4 = pRVar4->down_;
    pRVar8 = pRVar4;
  }
  if ((pRVar3 == (Regexp *)0x0) || (pRVar3->down_ != pRVar8)) {
    this_00 = (ParseState *)&subs;
    PODArray<re2::Regexp_*>::PODArray((PODArray<re2::Regexp_*> *)this_00,len);
    pPVar9 = (ParseState *)0x0;
    re = (ParseState *)this->stacktop_;
    iVar11 = len;
    while ((re != (ParseState *)0x0 &&
           (RVar2 = (RegexpOp)(byte)(char)re->flags_, RVar2 < (kRegexpCharClass|kRegexpEmptyMatch)))
          ) {
      pPVar9 = (ParseState *)(re->whole_regexp_).size_;
      lVar5 = (long)iVar11;
      if (RVar2 == op) {
        uVar6 = (ulong)*(ushort *)&re->field_0x6;
        if (uVar6 < 2) {
          pSVar10 = &re->whole_regexp_;
        }
        else {
          pSVar10 = (StringPiece *)(re->whole_regexp_).data_;
        }
        for (; lVar5 = lVar5 + -1, 0 < (long)uVar6; uVar6 = uVar6 - 1) {
          pRVar3 = Incref(*(Regexp **)((long)pSVar10 + uVar6 * 8 + -8));
          subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
          ._M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
          super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl[lVar5] = pRVar3;
          iVar11 = iVar11 + -1;
        }
        Decref((Regexp *)re);
        this_00 = re;
        re = pPVar9;
      }
      else {
        FinishRegexp(this_00,(Regexp *)re);
        iVar11 = iVar11 + -1;
        subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>.
        _M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
        super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl[lVar5 + -1] = (Regexp *)re;
        re = pPVar9;
      }
    }
    pRVar3 = ConcatOrAlternate(op,subs.ptr_._M_t.
                                  super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                                  .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl,len,
                               this->flags_,true);
    bVar1 = ComputeSimple(pRVar3);
    pRVar3->simple_ = bVar1;
    pRVar3->down_ = (Regexp *)pPVar9;
    this->stacktop_ = pRVar3;
    std::unique_ptr<re2::Regexp_*[],_re2::PODArray<re2::Regexp_*>::Deleter>::~unique_ptr(&subs.ptr_)
    ;
  }
  return;
}

Assistant:

void Regexp::ParseState::DoCollapse(RegexpOp op) {
  // Scan backward to marker, counting children of composite.
  int n = 0;
  Regexp* next = NULL;
  Regexp* sub;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op)
      n += sub->nsub_;
    else
      n++;
  }

  // If there's just one child, leave it alone.
  // (Concat of one thing is that one thing; alternate of one thing is same.)
  if (stacktop_ != NULL && stacktop_->down_ == next)
    return;

  // Construct op (alternation or concatenation), flattening op of op.
  PODArray<Regexp*> subs(n);
  next = NULL;
  int i = n;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op) {
      Regexp** sub_subs = sub->sub();
      for (int k = sub->nsub_ - 1; k >= 0; k--)
        subs[--i] = sub_subs[k]->Incref();
      sub->Decref();
    } else {
      subs[--i] = FinishRegexp(sub);
    }
  }

  Regexp* re = ConcatOrAlternate(op, subs.data(), n, flags_, true);
  re->simple_ = re->ComputeSimple();
  re->down_ = next;
  stacktop_ = re;
}